

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

void TestConstExpr::ConstCastTestT<unsigned_char>(void)

{
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar1;
  int iVar2;
  undefined8 in_RAX;
  undefined8 uStack_8;
  
  uStack_8 = in_RAX;
  if (ConstCastTestT<unsigned_char>()::b == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<unsigned_char>()::b);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<unsigned_char>();
      ConstCastTestT<unsigned_char>::b = SVar1.m_int != '\0';
      __cxa_guard_release(&ConstCastTestT<unsigned_char>()::b);
    }
  }
  if (ConstCastTestT<unsigned_char>()::w == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<unsigned_char>()::w);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<unsigned_char>();
      ConstCastTestT<unsigned_char>::w = (wchar_t)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<unsigned_char>()::w);
    }
  }
  if (ConstCastTestT<unsigned_char>()::c == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<unsigned_char>()::c);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<unsigned_char>();
      uStack_8 = CONCAT17(SVar1.m_int,(undefined7)uStack_8);
      ConstCastTestT<unsigned_char>::c =
           SafeInt::operator_cast_to_char((SafeInt *)((long)&uStack_8 + 7));
      __cxa_guard_release(&ConstCastTestT<unsigned_char>()::c);
    }
  }
  if (ConstCastTestT<unsigned_char>()::sc == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<unsigned_char>()::sc);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<unsigned_char>();
      uStack_8._0_7_ = CONCAT16(SVar1.m_int,(undefined6)uStack_8);
      ConstCastTestT<unsigned_char>::sc =
           SafeInt::operator_cast_to_signed_char((SafeInt *)((long)&uStack_8 + 6));
      __cxa_guard_release(&ConstCastTestT<unsigned_char>()::sc);
    }
  }
  if (ConstCastTestT<unsigned_char>()::uc == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<unsigned_char>()::uc);
    if (iVar2 != 0) {
      ConstCastTestT<unsigned_char>::uc = (uchar)ConstSafeInt<unsigned_char>();
      __cxa_guard_release(&ConstCastTestT<unsigned_char>()::uc);
    }
  }
  if (ConstCastTestT<unsigned_char>()::s == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<unsigned_char>()::s);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<unsigned_char>();
      ConstCastTestT<unsigned_char>::s = (short)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<unsigned_char>()::s);
    }
  }
  if (ConstCastTestT<unsigned_char>()::us == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<unsigned_char>()::us);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<unsigned_char>();
      ConstCastTestT<unsigned_char>::us = (unsigned_short)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<unsigned_char>()::us);
    }
  }
  if (ConstCastTestT<unsigned_char>()::i == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<unsigned_char>()::i);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<unsigned_char>();
      ConstCastTestT<unsigned_char>::i = (int)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<unsigned_char>()::i);
    }
  }
  if (ConstCastTestT<unsigned_char>()::ui == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<unsigned_char>()::ui);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<unsigned_char>();
      ConstCastTestT<unsigned_char>::ui = (uint)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<unsigned_char>()::ui);
    }
  }
  if (ConstCastTestT<unsigned_char>()::l == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<unsigned_char>()::l);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<unsigned_char>();
      ConstCastTestT<unsigned_char>::l = (long)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<unsigned_char>()::l);
    }
  }
  if (ConstCastTestT<unsigned_char>()::ul == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<unsigned_char>()::ul);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<unsigned_char>();
      ConstCastTestT<unsigned_char>::ul = (unsigned_long)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<unsigned_char>()::ul);
    }
  }
  if (ConstCastTestT<unsigned_char>()::ll == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<unsigned_char>()::ll);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<unsigned_char>();
      ConstCastTestT<unsigned_char>::ll = (longlong)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<unsigned_char>()::ll);
    }
  }
  if (ConstCastTestT<unsigned_char>()::ull == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<unsigned_char>()::ull);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<unsigned_char>();
      ConstCastTestT<unsigned_char>::ull = (unsigned_long_long)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<unsigned_char>()::ull);
    }
  }
  if (ConstCastTestT<unsigned_char>()::st == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<unsigned_char>()::st);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<unsigned_char>();
      ConstCastTestT<unsigned_char>::st = (size_t)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<unsigned_char>()::st);
    }
  }
  if (ConstCastTestT<unsigned_char>()::pt == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<unsigned_char>()::pt);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<unsigned_char>();
      ConstCastTestT<unsigned_char>::pt = (ptrdiff_t)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<unsigned_char>()::pt);
    }
  }
  if (ConstCastTestT<unsigned_char>()::pl == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<unsigned_char>()::pl);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<unsigned_char>();
      ConstCastTestT<unsigned_char>::pl = (int)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<unsigned_char>()::pl);
    }
  }
  return;
}

Assistant:

void ConstCastTestT()
	{
		static const bool b = ConstSafeInt<T>();
		static const wchar_t w = ConstSafeInt<T>();
		static const char c = ConstSafeInt<T>();
		static const signed char sc = ConstSafeInt<T>();
		static const unsigned char uc = ConstSafeInt<T>();
		static const signed short s = ConstSafeInt<T>();
		static const unsigned short us = ConstSafeInt<T>();
		static const signed int i = ConstSafeInt<T>();
		static const unsigned int ui = ConstSafeInt<T>();
		static const signed long l = ConstSafeInt<T>();
		static const unsigned long ul = ConstSafeInt<T>();
		static const signed long long ll = ConstSafeInt<T>();
		static const unsigned long long ull = ConstSafeInt<T>();
		static const size_t st = ConstSafeInt<T>();
		static const ptrdiff_t pt = ConstSafeInt<T>();

		// Also catch the useless unary + operator
		static const int pl = +ConstSafeInt<T>();
	}